

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O0

int WebRtcIsac_GetCrc(int16_t *bitstream,int len_bitstream_in_bytes,uint32_t *crc)

{
  int local_38;
  int crc_tbl_indx;
  int byte_cntr;
  uint32_t crc_state;
  uint8_t *bitstream_ptr_uw8;
  uint32_t *crc_local;
  int len_bitstream_in_bytes_local;
  int16_t *bitstream_local;
  
  if (bitstream == (int16_t *)0x0) {
    bitstream_local._4_4_ = -1;
  }
  else {
    crc_tbl_indx = -1;
    for (local_38 = 0; local_38 < len_bitstream_in_bytes; local_38 = local_38 + 1) {
      crc_tbl_indx = crc_tbl_indx << 8 ^
                     kCrcTable[(int)((uint)crc_tbl_indx >> 0x18 ^
                                    (uint)*(byte *)((long)bitstream + (long)local_38))];
    }
    *crc = crc_tbl_indx ^ 0xffffffff;
    bitstream_local._4_4_ = 0;
  }
  return bitstream_local._4_4_;
}

Assistant:

int WebRtcIsac_GetCrc(const int16_t* bitstream,
                      int len_bitstream_in_bytes,
                      uint32_t* crc)
{
  uint8_t* bitstream_ptr_uw8;
  uint32_t crc_state;
  int byte_cntr;
  int crc_tbl_indx;

  /* Sanity Check. */
  if (bitstream == NULL) {
    return -1;
  }
  /* cast to UWord8 pointer */
  bitstream_ptr_uw8 = (uint8_t *)bitstream;

  /* initialize */
  crc_state = 0xFFFFFFFF;

  for (byte_cntr = 0; byte_cntr < len_bitstream_in_bytes; byte_cntr++) {
    crc_tbl_indx = (WEBRTC_SPL_RSHIFT_U32(crc_state, 24) ^
                       bitstream_ptr_uw8[byte_cntr]) & 0xFF;
    crc_state = (crc_state << 8) ^ kCrcTable[crc_tbl_indx];
  }

  *crc = ~crc_state;
  return 0;
}